

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
nlohmann::json_abi_v3_11_3::detail::concat<std::__cxx11::string,char_const(&)[52],char_const*>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,detail *this,char (*args) [52],char **args_1)

{
  size_t sVar1;
  size_t sVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar1 = strlen((char *)this);
  sVar2 = strlen(*(char **)*args);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,sVar1 + sVar2);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,(char *)this);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,*(char **)*args);
  return __return_storage_ptr__;
}

Assistant:

inline OutStringType concat(Args && ... args)
{
    OutStringType str;
    str.reserve(concat_length(args...));
    concat_into(str, std::forward<Args>(args)...);
    return str;
}